

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

bool __thiscall QHostAddress::isInSubnet(QHostAddress *this,QHostAddress *subnet,int netmask)

{
  char cVar1;
  uint uVar2;
  QHostAddressPrivate *pQVar3;
  QHostAddressPrivate *pQVar4;
  int iVar5;
  anon_union_16_3_7ae2c192_for_QHostAddressPrivate_2 *__s2;
  anon_union_16_3_7ae2c192_for_QHostAddressPrivate_2 *__s1;
  uint uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  anon_union_4_2_e7985e1e net4;
  anon_union_4_2_e7985e1e ip4;
  anon_union_16_3_7ae2c192_for_QHostAddressPrivate_2 local_28;
  
  __s2 = &local_28;
  local_28.a6_64.c[1] = *(quint64 *)(in_FS_OFFSET + 0x28);
  bVar7 = false;
  if (netmask < 0) goto LAB_001ac881;
  pQVar3 = (subnet->d).d.ptr;
  cVar1 = pQVar3->protocol;
  pQVar4 = (this->d).d.ptr;
  if (cVar1 != pQVar4->protocol) goto LAB_001ac881;
  local_28.a6_32.c[1] = 0xaaaaaaaa;
  local_28.a6_32.c[0] = 0xaaaaaaaa;
  if (cVar1 == '\x01') {
    uVar6 = 0x80;
    if ((uint)netmask < 0x80) {
      uVar6 = netmask;
    }
    __s1 = &pQVar4->field_1;
    __s2 = &pQVar3->field_1;
LAB_001ac83c:
    if (7 < uVar6) {
      iVar5 = bcmp(__s1,__s2,(ulong)(uVar6 >> 3));
      if (iVar5 != 0) goto LAB_001ac857;
    }
    if ((uVar6 & 7) == 0) {
      bVar7 = true;
    }
    else {
      bVar7 = (byte)((*(byte *)((long)__s2 + (ulong)(uVar6 >> 3)) ^
                     *(quint8 *)((long)__s1 + (ulong)(uVar6 >> 3))) >>
                    (8U - (char)(uVar6 & 7) & 0x1f)) == 0;
    }
  }
  else {
    if (cVar1 == '\0') {
      uVar6 = 0x20;
      if ((uint)netmask < 0x20) {
        uVar6 = netmask;
      }
      uVar2 = pQVar4->a;
      __s1 = (anon_union_16_3_7ae2c192_for_QHostAddressPrivate_2 *)(local_28.a6.c + 4);
      local_28.a6_32.c[1] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = pQVar3->a;
      local_28.a6_32.c[0] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      goto LAB_001ac83c;
    }
LAB_001ac857:
    bVar7 = false;
  }
LAB_001ac881:
  if (*(quint64 *)(in_FS_OFFSET + 0x28) == local_28.a6_64.c[1]) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QHostAddress::isInSubnet(const QHostAddress &subnet, int netmask) const
{
    if (subnet.protocol() != d->protocol || netmask < 0)
        return false;

    union {
        quint32 ip;
        quint8 data[4];
    } ip4, net4;
    const quint8 *ip;
    const quint8 *net;
    if (d->protocol == QHostAddress::IPv4Protocol) {
        if (netmask > 32)
            netmask = 32;
        ip4.ip = qToBigEndian(d->a);
        net4.ip = qToBigEndian(subnet.d->a);
        ip = ip4.data;
        net = net4.data;
    } else if (d->protocol == QHostAddress::IPv6Protocol) {
        if (netmask > 128)
            netmask = 128;
        ip = d->a6.c;
        net = subnet.d->a6.c;
    } else {
        return false;
    }

    if (netmask >= 8 && memcmp(ip, net, netmask / 8) != 0)
        return false;
    if ((netmask & 7) == 0)
        return true;

    // compare the last octet now
    quint8 bytemask = 256 - (1 << (8 - (netmask & 7)));
    quint8 ipbyte = ip[netmask / 8];
    quint8 netbyte = net[netmask / 8];
    return (ipbyte & bytemask) == (netbyte & bytemask);
}